

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test
::TestBody(PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test *this)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  ByteBuffer *pBVar3;
  char *pcVar4;
  AssertHelper local_1b8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  PriceField price_field_price;
  PriceField price_field_string;
  PriceField price_field_unknown;
  double price;
  string string;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  FieldDef field_def_price;
  string local_a0 [40];
  FieldDef field_def_unknown;
  string local_70 [40];
  FieldDef field_def_string;
  string local_40 [40];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&string,"ciao",(allocator<char> *)&field_def_string);
  puVar2 = (undefined8 *)operator_new__(9);
  *puVar2 = 0x807060504030201;
  *(undefined1 *)(puVar2 + 1) = 9;
  price = 9876.543;
  std::__cxx11::string::string(local_c8,(string *)&string);
  puVar1 = &(this->super_PriceUpdateDecoderTest).field_0x18;
  bidfx_public_api::tools::Varint::WriteString(puVar1,local_c8);
  std::__cxx11::string::~string(local_c8);
  bidfx_public_api::tools::Varint::WriteU32((OutputStream *)puVar1,9);
  pBVar3 = &(this->super_PriceUpdateDecoderTest).buffer;
  bidfx_public_api::tools::ByteBuffer::WriteBytes((uchar *)pBVar3,(ulong)puVar2);
  bidfx_public_api::tools::Varint::WriteU64((OutputStream *)puVar1,0x24cb01618);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"field",(allocator<char> *)&field_def_unknown);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(&field_def_string,1,0x53,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"field",(allocator<char> *)&field_def_price);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(&field_def_unknown,1,0x20,local_108,0x42,0);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::string<std::allocator<char>>(local_128,"field",(allocator<char> *)&gtest_ar)
  ;
  bidfx_public_api::price::pixie::FieldDef::FieldDef(&field_def_price,1,0x44,local_128,0x56,6);
  std::__cxx11::string::~string(local_128);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&price_field_string,(FieldDef *)pBVar3);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&price_field_unknown,(FieldDef *)pBVar3);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&price_field_price,(FieldDef *)pBVar3);
  gtest_ar_1._0_4_ = 3;
  local_1b8.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&gtest_ar,"PriceField::STRING","price_field_string.GetType()",
             (Type *)&gtest_ar_1,(Type *)&local_1b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"string","price_field_string.GetString()",&string,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  gtest_ar_1._0_4_ = 4;
  local_1b8.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&gtest_ar,"PriceField::NOTHING","price_field_unknown.GetType()",
             (Type *)&gtest_ar_1,(Type *)&local_1b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_1._0_4_ = 2;
  local_1b8.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&gtest_ar,"PriceField::DOUBLE","price_field_price.GetType()",
             (Type *)&gtest_ar_1,(Type *)&local_1b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_1._0_8_ = bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"price","price_field_price.GetDouble()",&price,
             (double *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::PriceField::~PriceField(&price_field_price);
  bidfx_public_api::price::PriceField::~PriceField(&price_field_unknown);
  bidfx_public_api::price::PriceField::~PriceField(&price_field_string);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&string);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_skip_bytes_in_case_type_is_unknown)
{
    std::string string = "ciao";
    unsigned char* unknown = new unsigned char[9]{1, 2, 3, 4, 5, 6, 7, 8, 9};
    double price = 9876.543;

    // STRING
    Varint::WriteString(buffer, string);
    // UNDECODABLE
    Varint::WriteU32(buffer, 9);
    buffer.WriteBytes(unknown, 9);
    // PRICE
    Varint::WriteU64(buffer, (uint64_t)(price * 1000000));

    FieldDef field_def_string = FieldDef(1, FieldTypeEnum::STRING, "field");
    FieldDef field_def_unknown = FieldDef(1, FieldTypeEnum::UNRECOGNISED, "field", FieldEncodingEnum::BYTE_ARRAY, 0);
    FieldDef field_def_price = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field_string = PriceUpdateDecoder::DecodeField(buffer, field_def_string);
    PriceField price_field_unknown = PriceUpdateDecoder::DecodeField(buffer, field_def_unknown);
    PriceField price_field_price = PriceUpdateDecoder::DecodeField(buffer, field_def_price);

    EXPECT_EQ(PriceField::STRING, price_field_string.GetType());
    EXPECT_EQ(string, price_field_string.GetString());
    EXPECT_EQ(PriceField::NOTHING, price_field_unknown.GetType());
    EXPECT_EQ(PriceField::DOUBLE, price_field_price.GetType());
    EXPECT_EQ(price, price_field_price.GetDouble());
}